

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyFraig.c
# Opt level: O0

void Ivy_FraigResimulate(Ivy_FraigMan_t *p)

{
  int iVar1;
  int nChanges;
  Ivy_FraigMan_t *p_local;
  
  Ivy_FraigAssignDist1(p,p->pPatWords);
  Ivy_FraigSimulateOne(p);
  if (p->pParams->fPatScores != 0) {
    Ivy_FraigCleanPatScores(p);
  }
  iVar1 = Ivy_FraigRefineClasses(p);
  if (p->pManFraig->pData == (void *)0x0) {
    if (iVar1 < 1) {
      printf("Error: A counter-example did not refine classes!\n");
      __assert_fail("nChanges >= 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/ivy/ivyFraig.c"
                    ,0x6e4,"void Ivy_FraigResimulate(Ivy_FraigMan_t *)");
    }
    if (p->pParams->fPatScores != 0) {
      while (iVar1 = Ivy_FraigSelectBestPat(p), p->pParams->MaxScore < iVar1) {
        Ivy_FraigAssignDist1(p,p->pPatWords);
        Ivy_FraigSimulateOne(p);
        Ivy_FraigCleanPatScores(p);
        iVar1 = Ivy_FraigRefineClasses(p);
        if (p->pManFraig->pData != (void *)0x0) {
          return;
        }
        if (iVar1 == 0) {
          return;
        }
      }
    }
  }
  return;
}

Assistant:

void Ivy_FraigResimulate( Ivy_FraigMan_t * p )
{
    int nChanges;
    Ivy_FraigAssignDist1( p, p->pPatWords );
    Ivy_FraigSimulateOne( p );
    if ( p->pParams->fPatScores )
        Ivy_FraigCleanPatScores( p );
    nChanges = Ivy_FraigRefineClasses( p );
    if ( p->pManFraig->pData )
        return;
    if ( nChanges < 1 )
        printf( "Error: A counter-example did not refine classes!\n" );
    assert( nChanges >= 1 );
//printf( "Refined classes! = %5d.   Changes = %4d.\n", p->lClasses.nItems, nChanges );
    if ( !p->pParams->fPatScores )
        return;

    // perform additional simulation using dist1 patterns derived from successful patterns
    while ( Ivy_FraigSelectBestPat(p) > p->pParams->MaxScore )
    {
        Ivy_FraigAssignDist1( p, p->pPatWords );
        Ivy_FraigSimulateOne( p );
        Ivy_FraigCleanPatScores( p );
        nChanges = Ivy_FraigRefineClasses( p );
        if ( p->pManFraig->pData )
            return;
//printf( "Refined class!!! = %5d.   Changes = %4d.   Pairs = %6d.\n", p->lClasses.nItems, nChanges, Ivy_FraigCountPairsClasses(p) );
        if ( nChanges == 0 )
            break;
    }
}